

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O0

void __thiscall trun::DynLibLinux::DynLibLinux(DynLibLinux *this)

{
  ILogger *pIVar1;
  allocator<char> local_31;
  string local_30;
  DynLibLinux *local_10;
  DynLibLinux *this_local;
  
  local_10 = this;
  IDynLibrary::IDynLibrary(&this->super_IDynLibrary);
  (this->super_IDynLibrary)._vptr_IDynLibrary = (_func_int **)&PTR__DynLibLinux_002d4f28;
  std::__cxx11::string::string((string *)&this->pathName);
  this->handle = (void *)0x0;
  this->pLogger = (ILogger *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->exports);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->symbols);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Loader",&local_31);
  pIVar1 = gnilk::Logger::GetLogger(&local_30);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

DynLibLinux::DynLibLinux() {
    this->pLogger = gnilk::Logger::GetLogger("Loader");
}